

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O2

string * __thiscall
RenX_ServerListPlugin::server_as_long_json_abi_cxx11_
          (string *__return_storage_ptr__,RenX_ServerListPlugin *this,Server *server)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  size_t index;
  pointer pbVar13;
  char *pcVar14;
  long lVar15;
  size_t index_1;
  char *pcVar16;
  char *pcVar17;
  long *plVar18;
  undefined4 uVar19;
  string_view sVar20;
  string_view in_str;
  string_view in_str_00;
  string_view in_str_01;
  string_view in_str_02;
  string_view in_str_03;
  string_view in_str_04;
  string local_228;
  string server_json_block;
  vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_> activePlayers;
  long *local_1d0;
  string server_attributes;
  ListServerInfo serverInfo;
  string server_prefix;
  string server_version;
  string server_map;
  string server_name;
  
  getListServerInfo(&serverInfo,this,server);
  sVar20 = (string_view)RenX::Server::getName();
  jsonify_abi_cxx11_(&server_name,sVar20);
  lVar4 = RenX::Server::getMap();
  sVar20._M_str = *(char **)(lVar4 + 0x10);
  sVar20._M_len = *(size_t *)(lVar4 + 0x18);
  jsonify_abi_cxx11_(&server_map,sVar20);
  sVar20 = (string_view)RenX::Server::getGameVersion();
  jsonify_abi_cxx11_(&server_version,sVar20);
  jsonify_abi_cxx11_(&server_prefix,serverInfo.namePrefix);
  RenX::Server::activePlayers(SUB81(&activePlayers,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&server_attributes,"[]",(allocator<char> *)&server_json_block);
  if (serverInfo.attributes.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      serverInfo.attributes.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&server_attributes,
               (long)serverInfo.attributes.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish +
               (0x10 - (long)serverInfo.attributes.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&server_attributes,"[");
    pcVar7 = "\n";
    for (pbVar13 = serverInfo.attributes.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar13 !=
        serverInfo.attributes.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar13 = pbVar13 + 1) {
      server_json_block._M_dataplus._M_p = (pointer)pbVar13->_M_len;
      server_json_block._M_string_length = (size_type)pbVar13->_M_str;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&server_attributes,pcVar7);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&server_attributes,"\t\t\t\"");
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&server_attributes,
                 (basic_string_view<char,_std::char_traits<char>_> *)&server_json_block);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&server_attributes,"\"");
      pcVar7 = ",\n";
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_attributes,"\n\t\t],");
  }
  uVar5 = RenX::Server::getBotCount();
  lVar4 = (long)local_1d0 - (long)_activePlayers;
  uVar6 = RenX::Server::getMineLimit();
  cVar1 = RenX::Server::isSteamRequired();
  pcVar17 = "false";
  pcVar7 = "false";
  if (cVar1 != '\0') {
    pcVar7 = "true";
  }
  cVar1 = RenX::Server::isPrivateMessageTeamOnly();
  pcVar8 = "false";
  if (cVar1 != '\0') {
    pcVar8 = "true";
  }
  cVar1 = RenX::Server::isPassworded();
  pcVar9 = "false";
  if (cVar1 != '\0') {
    pcVar9 = "true";
  }
  cVar1 = RenX::Server::isPrivateMessagingEnabled();
  pcVar16 = "false";
  if (cVar1 != '\0') {
    pcVar16 = "true";
  }
  uVar10 = RenX::Server::getPlayerLimit();
  uVar11 = RenX::Server::getVehicleLimit();
  iVar2 = RenX::Server::getTeamMode();
  pcVar14 = "false";
  if (iVar2 == 3) {
    pcVar14 = "true";
  }
  uVar12 = RenX::Server::getTeamMode();
  cVar1 = RenX::Server::isCratesEnabled();
  if (cVar1 != '\0') {
    pcVar17 = "true";
  }
  uVar19 = RenX::Server::getCrateRespawnDelay();
  uVar3 = RenX::Server::getTimeLimit();
  string_printf_abi_cxx11_
            (&server_json_block,
             "{\n\t\t\"Name\": \"%.*s\",\n\t\t\"NamePrefix\": \"%.*s\",\n\t\t\"Current Map\": \"%.*s\",\n\t\t\"Bots\": %u,\n\t\t\"Players\": %u,\n\t\t\"Game Version\": \"%.*s\",\n\t\t\"Attributes\": %.*s,\n\t\t\"Variables\": {\n\t\t\t\"Mine Limit\": %d,\n\t\t\t\"bSteamRequired\": %s,\n\t\t\t\"bPrivateMessageTeamOnly\": %s,\n\t\t\t\"bPassworded\": %s,\n\t\t\t\"bAllowPrivateMessaging\": %s,\n\t\t\t\"Player Limit\": %d,\n\t\t\t\"Vehicle Limit\": %d,\n\t\t\t\"bAutoBalanceTeams\": %s,\n\t\t\t\"Team Mode\": %d,\n\t\t\t\"bSpawnCrates\": %s,\n\t\t\t\"CrateRespawnAfterPickup\": %f,\n\t\t\t\"Time Limit\": %d\n\t\t},\n\t\t\"Port\": %u,\n\t\t\"IP\": \"%.*s\""
             ,uVar19,server_name._M_string_length,server_name._M_dataplus._M_p,
             server_prefix._M_string_length,server_prefix._M_dataplus._M_p,
             server_map._M_string_length,server_map._M_dataplus._M_p,uVar5,lVar4 >> 3,
             server_version._M_string_length,server_version._M_dataplus._M_p,
             server_attributes._M_string_length,server_attributes._M_dataplus._M_p,uVar6,pcVar7,
             pcVar8,pcVar9,pcVar16,uVar10,uVar11,pcVar14,uVar12,pcVar17,(ulong)uVar3,
             (ulong)serverInfo.port,serverInfo.hostname._M_len,serverInfo.hostname._M_str);
  if (*(long *)(server + 0x60) != *(long *)(server + 0x58)) {
    local_228._M_dataplus._M_p = (pointer)0xf;
    local_228._M_string_length = 0x1154e7;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&server_json_block,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
    local_228._M_dataplus._M_p = (pointer)0x13;
    local_228._M_string_length = 0x115510;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&server_json_block,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
    in_str._M_str = *(char **)(*(long *)(server + 0x58) + 0x10);
    in_str._M_len = *(size_t *)(*(long *)(server + 0x58) + 0x18);
    jsonify_abi_cxx11_(&local_228,in_str);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    local_228._M_dataplus._M_p = (pointer)0x10;
    local_228._M_string_length = 0x1154f7;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&server_json_block,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
    RenX::formatGUID_abi_cxx11_((Map *)&local_228);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    local_228._M_dataplus._M_p = (pointer)0x6;
    local_228._M_string_length = 0x115508;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&server_json_block,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
    lVar15 = 0x30;
    for (lVar4 = 1; lVar4 != (*(long *)(server + 0x60) - *(long *)(server + 0x58)) / 0x30;
        lVar4 = lVar4 + 1) {
      local_228._M_dataplus._M_p = (pointer)0x14;
      local_228._M_string_length = 0x11550f;
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&server_json_block,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
      in_str_00._M_str = *(char **)(*(long *)(server + 0x58) + 0x10 + lVar15);
      in_str_00._M_len = *(size_t *)(*(long *)(server + 0x58) + 0x18 + lVar15);
      jsonify_abi_cxx11_(&local_228,in_str_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&server_json_block,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      local_228._M_dataplus._M_p = (pointer)0x10;
      local_228._M_string_length = 0x1154f7;
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&server_json_block,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
      RenX::formatGUID_abi_cxx11_((Map *)&local_228);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&server_json_block,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      local_228._M_dataplus._M_p = (pointer)0x6;
      local_228._M_string_length = 0x115508;
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&server_json_block,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
      lVar15 = lVar15 + 0x30;
    }
    local_228._M_dataplus._M_p = &DAT_00000004;
    local_228._M_string_length = 0x115524;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&server_json_block,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
  }
  if (*(long *)(server + 0x48) != *(long *)(server + 0x40)) {
    local_228._M_dataplus._M_p = (pointer)0x11;
    local_228._M_string_length = 0x115529;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&server_json_block,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
    local_228._M_dataplus._M_p = (pointer)0x13;
    local_228._M_string_length = 0x115510;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&server_json_block,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
    in_str_01._M_str = (char *)**(undefined8 **)(server + 0x40);
    in_str_01._M_len = (*(undefined8 **)(server + 0x40))[1];
    jsonify_abi_cxx11_(&local_228,in_str_01);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    local_228._M_dataplus._M_p = (pointer)0x6;
    local_228._M_string_length = 0x115508;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&server_json_block,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
    lVar15 = 0x28;
    for (lVar4 = 1; lVar4 != *(long *)(server + 0x48) - *(long *)(server + 0x40) >> 5;
        lVar4 = lVar4 + 1) {
      local_228._M_dataplus._M_p = (pointer)0x14;
      local_228._M_string_length = 0x11550f;
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&server_json_block,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
      in_str_02._M_str = *(char **)(*(long *)(server + 0x40) + -8 + lVar15);
      in_str_02._M_len = *(size_t *)(*(long *)(server + 0x40) + lVar15);
      jsonify_abi_cxx11_(&local_228,in_str_02);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&server_json_block,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      local_228._M_dataplus._M_p = (pointer)0x6;
      local_228._M_string_length = 0x115508;
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&server_json_block,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
      lVar15 = lVar15 + 0x20;
    }
    local_228._M_dataplus._M_p = &DAT_00000004;
    local_228._M_string_length = 0x115524;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&server_json_block,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
  }
  if (local_1d0 != _activePlayers) {
    local_228._M_dataplus._M_p = (pointer)0x13;
    local_228._M_string_length = 0x11553b;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&server_json_block,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
    local_228._M_dataplus._M_p = (pointer)0x13;
    local_228._M_string_length = 0x115510;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&server_json_block,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
    in_str_03._M_str = *(char **)(*_activePlayers + 8);
    in_str_03._M_len = *(size_t *)(*_activePlayers + 0x10);
    jsonify_abi_cxx11_(&local_228,in_str_03);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    local_228._M_dataplus._M_p = (pointer)0x6;
    local_228._M_string_length = 0x115508;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&server_json_block,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
    plVar18 = _activePlayers;
    while (plVar18 = plVar18 + 1, plVar18 != local_1d0) {
      local_228._M_dataplus._M_p = (pointer)0x14;
      local_228._M_string_length = 0x11550f;
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&server_json_block,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
      in_str_04._M_str = *(char **)(*plVar18 + 8);
      in_str_04._M_len = *(size_t *)(*plVar18 + 0x10);
      jsonify_abi_cxx11_(&local_228,in_str_04);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&server_json_block,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      local_228._M_dataplus._M_p = (pointer)0x6;
      local_228._M_string_length = 0x115508;
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&server_json_block,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
    }
    local_228._M_dataplus._M_p = &DAT_00000004;
    local_228._M_string_length = 0x115524;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&server_json_block,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
  }
  local_228._M_dataplus._M_p = (pointer)0x3;
  local_228._M_string_length = 0x11554f;
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&server_json_block,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_228);
  std::__cxx11::string::string((string *)__return_storage_ptr__,&server_json_block);
  std::__cxx11::string::~string((string *)&server_json_block);
  std::__cxx11::string::~string((string *)&server_attributes);
  std::_Vector_base<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>::
  ~_Vector_base((_Vector_base<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_> *
                )&activePlayers);
  std::__cxx11::string::~string((string *)&server_prefix);
  std::__cxx11::string::~string((string *)&server_version);
  std::__cxx11::string::~string((string *)&server_map);
  std::__cxx11::string::~string((string *)&server_name);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&serverInfo.attributes.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

std::string RenX_ServerListPlugin::server_as_long_json(const RenX::Server &server) {
	ListServerInfo serverInfo = getListServerInfo(server);

	std::string server_name = jsonify(server.getName());
	std::string server_map = jsonify(server.getMap().name);
	std::string server_version = jsonify(server.getGameVersion());
	std::string_view server_hostname = serverInfo.hostname;
	unsigned short server_port = serverInfo.port;
	std::string server_prefix = jsonify(serverInfo.namePrefix);
	std::vector<const RenX::PlayerInfo*> activePlayers = server.activePlayers(false);

	std::string server_attributes = "[]";
	if (!serverInfo.attributes.empty()) {
		server_attributes.reserve(16 * serverInfo.attributes.size() + 16);
		server_attributes = "[";

		const char* comma = "\n";
		for (std::string_view attribute : serverInfo.attributes) {
			server_attributes += comma;
			comma = ",\n";

			server_attributes += "\t\t\t\"";
			server_attributes += attribute;
			server_attributes += "\"";
		}

		server_attributes += "\n\t\t],";
	}

	std::string server_json_block = string_printf(R"json({
		"Name": "%.*s",
		"NamePrefix": "%.*s",
		"Current Map": "%.*s",
		"Bots": %u,
		"Players": %u,
		"Game Version": "%.*s",
		"Attributes": %.*s,
		"Variables": {
			"Mine Limit": %d,
			"bSteamRequired": %s,
			"bPrivateMessageTeamOnly": %s,
			"bPassworded": %s,
			"bAllowPrivateMessaging": %s,
			"Player Limit": %d,
			"Vehicle Limit": %d,
			"bAutoBalanceTeams": %s,
			"Team Mode": %d,
			"bSpawnCrates": %s,
			"CrateRespawnAfterPickup": %f,
			"Time Limit": %d
		},
		"Port": %u,
		"IP": "%.*s")json",
		server_name.size(), server_name.data(),
		server_prefix.size(), server_prefix.data(),
		server_map.size(), server_map.data(),
		server.getBotCount(),
		activePlayers.size(),
		server_version.size(), server_version.data(),
		server_attributes.size(), server_attributes.data(),

		server.getMineLimit(),
		json_bool_as_cstring(server.isSteamRequired()),
		json_bool_as_cstring(server.isPrivateMessageTeamOnly()),
		json_bool_as_cstring(server.isPassworded()),
		json_bool_as_cstring(server.isPrivateMessagingEnabled()),
		server.getPlayerLimit(),
		server.getVehicleLimit(),
		json_bool_as_cstring(server.getTeamMode() == 3),
		server.getTeamMode(),
		json_bool_as_cstring(server.isCratesEnabled()),
		server.getCrateRespawnDelay(),
		server.getTimeLimit(),

		server_port,
		server_hostname.size(), server_hostname.data());

	// Level Rotation
	if (server.maps.size() != 0) {
		server_json_block += ",\n\t\t\"Levels\": ["sv;

		server_json_block += "\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
		server_json_block += jsonify(server.maps[0].name);
		server_json_block += "\",\n\t\t\t\t\"GUID\": \""sv;
		server_json_block += RenX::formatGUID(server.maps[0]);
		server_json_block += "\"\n\t\t\t}"sv;

		for (size_t index = 1; index != server.maps.size(); ++index) {
			server_json_block += ",\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
			server_json_block += jsonify(server.maps[index].name);
			server_json_block += "\",\n\t\t\t\t\"GUID\": \""sv;
			server_json_block += RenX::formatGUID(server.maps[index]);
			server_json_block += "\"\n\t\t\t}"sv;
		}

		server_json_block += "\n\t\t]"sv;
	}

	// Mutators
	if (server.mutators.size() != 0) {
		server_json_block += ",\n\t\t\"Mutators\": ["sv;

		server_json_block += "\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
		server_json_block += jsonify(server.mutators[0]);
		server_json_block += "\"\n\t\t\t}"sv;

		for (size_t index = 1; index != server.mutators.size(); ++index) {
			server_json_block += ",\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
			server_json_block += jsonify(server.mutators[index]);
			server_json_block += "\"\n\t\t\t}"sv;
		}

		server_json_block += "\n\t\t]"sv;
	}

	// Player List
	if (activePlayers.size() != 0) {
		server_json_block += ",\n\t\t\"PlayerList\": ["sv;

		auto node = activePlayers.begin();

		// Add first player to JSON
		server_json_block += "\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
		server_json_block += jsonify((*node)->name);
		server_json_block += "\"\n\t\t\t}"sv;
		++node;

		// Add remaining players to JSON
		while (node != activePlayers.end()) {
			server_json_block += ",\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
			server_json_block += jsonify((*node)->name);
			server_json_block += "\"\n\t\t\t}"sv;
			++node;
		}

		server_json_block += "\n\t\t]"sv;
	}

	server_json_block += "\n\t}"sv;

	return static_cast<std::string>(server_json_block);
}